

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::StartShutDown(cmServerBase *this)

{
  pointer puVar1;
  cmConnection *pcVar2;
  pointer *__ptr;
  pointer puVar3;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar4;
  unique_lock<cm::shared_mutex> lock;
  unique_lock<cm::shared_mutex> local_30;
  
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&this->ShutdownSignal);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGINTHandler);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGHUPHandler);
  local_30._M_device = &this->ConnectionsMutex;
  local_30._M_owns = false;
  std::unique_lock<cm::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->Connections).
                super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*((puVar4->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
       super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
       super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl)->_vptr_cmConnection[3])();
  }
  puVar4 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = puVar4;
  if (puVar1 != puVar4) {
    do {
      pcVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
      if (pcVar2 != (cmConnection *)0x0) {
        (*pcVar2->_vptr_cmConnection[2])();
      }
      (puVar3->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
      super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
      super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = (cmConnection *)0x0;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    (this->Connections).
    super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  std::unique_lock<cm::shared_mutex>::~unique_lock(&local_30);
  uv_walk(&this->Loop,on_walk_to_shutdown,(void *)0x0);
  return;
}

Assistant:

void cmServerBase::StartShutDown()
{
  ShutdownSignal.reset();
  SIGINTHandler.reset();
  SIGHUPHandler.reset();

  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      connection->OnConnectionShuttingDown();
    }
    Connections.clear();
  }

  uv_walk(&Loop, on_walk_to_shutdown, nullptr);
}